

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadTorus> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  mapped_type_conflict *pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  TPZGeoElSide neigh;
  long local_68;
  undefined **local_60;
  TPZGeoEl *local_58;
  int local_50;
  TPZGeoElSide local_48;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap);
  pvVar2 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar2;
  *(void **)((long)(this->fGeo).super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
                   fNodeIndexes + *(long *)((long)pvVar2 + -0x60) + -0x48) = vtt[3];
  pzgeom::TPZQuadTorus::TPZQuadTorus(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  lVar4 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar4) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar4) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar4) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd8);
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar4 = 0;
LAB_00efbbeb:
  TPZGeoElSide::TPZGeoElSide(&local_48,cp->fNeighbours + lVar4,(cp->super_TPZGeoEl).fMesh);
  do {
    iVar3 = local_48.fSide;
    local_68 = (local_48.fGeoEl)->fIndex;
    p_Var7 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    if (p_Var7 == (_Base_ptr)0x0) {
LAB_00efbc66:
      (**(code **)(*(long *)local_48.fGeoEl + 0x188))(&local_60,local_48.fGeoEl,local_48.fSide);
    }
    else {
      do {
        if (local_68 <= (long)*(size_t *)(p_Var7 + 1)) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(long)*(size_t *)(p_Var7 + 1) < local_68];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         ((long)((_Rb_tree_header *)p_Var6)->_M_node_count <= local_68)) break;
      if (local_48.fGeoEl != (TPZGeoEl *)0x0) goto LAB_00efbc66;
      local_60 = &PTR__TPZGeoElSide_018f8760;
      local_58 = (TPZGeoEl *)0x0;
      local_50 = -1;
    }
    local_48.fSide = local_50;
    local_48.fGeoEl = local_58;
  } while( true );
  pmVar5 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&local_68);
  this->fNeighbours[lVar4].fGeoElIndex = *pmVar5;
  this->fNeighbours[lVar4].fSide = iVar3;
  lVar4 = lVar4 + 1;
  if (lVar4 == 9) {
    return;
  }
  goto LAB_00efbbeb;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}